

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O0

int __thiscall
zmq::null_mechanism_t::process_error_command
          (null_mechanism_t *this,uchar *cmd_data_,size_t data_size_)

{
  socket_base_t *psVar1;
  int *piVar2;
  ulong in_RDX;
  char *in_RSI;
  socket_base_t *in_RDI;
  char *error_reason;
  size_t error_reason_len;
  size_t fixed_prefix_size;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar3;
  endpoint_uri_pair_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (in_RDX < 7) {
    psVar1 = session_base_t::get_socket
                       ((session_base_t *)
                        (in_RDI->_endpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    session_base_t::get_endpoint((session_base_t *)0x316d98);
    socket_base_t::event_handshake_failed_protocol(in_RDI,(endpoint_uri_pair_t *)psVar1,iVar3);
    piVar2 = __errno_location();
    *piVar2 = 0x47;
    local_4 = -1;
  }
  else if (in_RDX - 7 < (ulong)(byte)in_RSI[6]) {
    psVar1 = session_base_t::get_socket
                       ((session_base_t *)
                        (in_RDI->_endpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar3 = (int)((ulong)psVar1 >> 0x20);
    session_base_t::get_endpoint((session_base_t *)0x316e0d);
    socket_base_t::event_handshake_failed_protocol(in_RDI,in_stack_ffffffffffffffb8,iVar3);
    piVar2 = __errno_location();
    *piVar2 = 0x47;
    local_4 = -1;
  }
  else {
    mechanism_base_t::handle_error_reason((mechanism_base_t *)in_RDI,in_RSI,in_RDX);
    (((mechanism_t *)&in_RDI->super_own_t)->options).routing_id[0x32] = '\x01';
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::null_mechanism_t::process_error_command (
  const unsigned char *cmd_data_, size_t data_size_)
{
    const size_t fixed_prefix_size =
      error_command_name_len + error_reason_len_size;
    if (data_size_ < fixed_prefix_size) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MALFORMED_COMMAND_ERROR);

        errno = EPROTO;
        return -1;
    }
    const size_t error_reason_len =
      static_cast<size_t> (cmd_data_[error_command_name_len]);
    if (error_reason_len > data_size_ - fixed_prefix_size) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MALFORMED_COMMAND_ERROR);

        errno = EPROTO;
        return -1;
    }
    const char *error_reason =
      reinterpret_cast<const char *> (cmd_data_) + fixed_prefix_size;
    handle_error_reason (error_reason, error_reason_len);
    _error_command_received = true;
    return 0;
}